

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::tryGetEntry(Impl *this,StringPtr name)

{
  char *pcVar1;
  bool bVar2;
  long *plVar3;
  Clock *pCVar4;
  char *pcVar5;
  char *pcVar6;
  ArrayPtr<const_char> local_38;
  
  local_38.ptr = (char *)name.content.size_;
  pcVar6 = name.content.ptr + 0x18;
  plVar3 = (long *)(name.content.ptr + 0x20);
  pcVar5 = pcVar6;
  while (pcVar1 = (char *)*plVar3, pcVar1 != (char *)0x0) {
    bVar2 = ArrayPtr<const_char>::operator<((ArrayPtr<const_char> *)(pcVar1 + 0x20),&local_38);
    if (!bVar2) {
      pcVar5 = pcVar1;
    }
    plVar3 = (long *)(pcVar1 + (ulong)bVar2 * 8 + 0x10);
  }
  if (pcVar5 == pcVar6) {
    pCVar4 = (Clock *)0x0;
  }
  else {
    bVar2 = ArrayPtr<const_char>::operator<(&local_38,(ArrayPtr<const_char> *)(pcVar5 + 0x20));
    pCVar4 = (Clock *)0x0;
    if (!bVar2) {
      pCVar4 = (Clock *)(pcVar5 + 0x30);
    }
  }
  this->clock = pCVar4;
  return (Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)(EntryImpl *)this;
}

Assistant:

kj::Maybe<const EntryImpl&> tryGetEntry(kj::StringPtr name) const {
      auto iter = entries.find(name);
      if (iter == entries.end()) {
        return kj::none;
      } else {
        return iter->second;
      }
    }